

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::exceptions::parsing::parsing(parsing *this,string *message)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)message);
  exception::exception(&this->super_exception,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_exception = &PTR__exception_001a6968;
  return;
}

Assistant:

explicit parsing(const std::string& message)
  : exception(message)
  {
  }